

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O3

void __thiscall
duckdb::ParquetReader::ParquetReader
          (ParquetReader *this,ClientContext *context_p,OpenFileInfo *file_p,
          ParquetOptions *parquet_options_p,
          shared_ptr<duckdb::ParquetFileMetadataCache,_true> *metadata_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  shared_ptr<duckdb::ExtendedOpenFileInfo,_true> *this_00;
  unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
  *this_01;
  shared_ptr<duckdb::EncryptionUtil,_true> *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pcVar5;
  element_type *peVar6;
  pointer pPVar7;
  undefined8 uVar8;
  char cVar9;
  bool bVar10;
  ParquetFileMetadataCache *__tmp_2;
  Allocator *pAVar11;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var12;
  iterator iVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  key_type *__k;
  long lVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  undefined1 auVar16 [8];
  ParquetFileMetadataCache *pPVar17;
  type pCVar18;
  type pEVar19;
  ObjectCache *this_03;
  NotImplementedException *this_04;
  ParquetEncryptionConfig *__tmp;
  pointer *__ptr;
  FileOpenFlags FVar20;
  Value metadata_cache;
  shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> local_120;
  optional_idx local_110;
  undefined1 local_108 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [64];
  CachingFileSystem *local_a8;
  shared_ptr<duckdb::ObjectCacheEntry,_true> local_a0;
  OpenFileInfo *local_90;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> *local_88;
  string local_80;
  OpenFileInfo local_60;
  
  paVar2 = &local_60.path.field_2;
  local_60.path._M_dataplus._M_p = (file_p->path)._M_dataplus._M_p;
  paVar1 = &(file_p->path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.path._M_dataplus._M_p == paVar1) {
    local_60.path.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_60.path.field_2._8_8_ = *(undefined8 *)((long)&(file_p->path).field_2 + 8);
    local_60.path._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_60.path.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_60.path._M_string_length = (file_p->path)._M_string_length;
  (file_p->path)._M_dataplus._M_p = (pointer)paVar1;
  (file_p->path)._M_string_length = 0;
  (file_p->path).field_2._M_local_buf[0] = '\0';
  local_60.extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (file_p->extended_info).internal.
       super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_60.extended_info.internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (file_p->extended_info).internal.
       super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  (file_p->extended_info).internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (file_p->extended_info).internal.
  super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  BaseFileReader::BaseFileReader(&this->super_BaseFileReader,&local_60);
  if (local_60.extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.extended_info.internal.
               super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.path._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.path._M_dataplus._M_p);
  }
  (this->super_BaseFileReader)._vptr_BaseFileReader = (_func_int **)&PTR__ParquetReader_0049b238;
  local_a8 = &this->fs;
  duckdb::CachingFileSystem::Get((ClientContext *)local_a8);
  pAVar11 = (Allocator *)duckdb::BufferAllocator::Get(context_p);
  this->allocator = pAVar11;
  (this->metadata).internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->metadata).internal.
  super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar10 = parquet_options_p->file_row_number;
  (this->parquet_options).binary_as_string = parquet_options_p->binary_as_string;
  (this->parquet_options).file_row_number = bVar10;
  (this->parquet_options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar6 = (parquet_options_p->encryption_config).internal.
           super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var15 = (parquet_options_p->encryption_config).internal.
            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (parquet_options_p->encryption_config).internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->parquet_options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  (this->parquet_options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var15;
  (parquet_options_p->encryption_config).internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->parquet_options).debug_use_openssl = parquet_options_p->debug_use_openssl;
  pPVar7 = (parquet_options_p->schema).
           super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
           .
           super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (parquet_options_p->schema).
       super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
       .
       super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPVar7;
  (this->parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (parquet_options_p->schema).
       super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
       .
       super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (parquet_options_p->schema).
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (parquet_options_p->schema).
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (parquet_options_p->schema).
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parquet_options).explicit_cardinality = parquet_options_p->explicit_cardinality;
  this_01 = &this->file_handle;
  (this->file_handle).
  super_unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>._M_t.
  super___uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::CachingFileHandle_*,_std::default_delete<duckdb::CachingFileHandle>_>
  .super__Head_base<0UL,_duckdb::CachingFileHandle_*,_false>._M_head_impl = (CachingFileHandle *)0x0
  ;
  (this->encryption_util).internal.
  super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->root_schema).
  super_unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ParquetColumnSchema_*,_std::default_delete<duckdb::ParquetColumnSchema>_>
  .super__Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false>._M_head_impl =
       (ParquetColumnSchema *)0x0;
  (this->encryption_util).internal.
  super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_90 = &(this->super_BaseFileReader).file;
  FVar20._8_8_ = local_90;
  FVar20.flags = (idx_t)local_a8;
  duckdb::CachingFileSystem::OpenFile((OpenFileInfo *)local_e8,FVar20);
  __k = (key_type *)local_e8._0_8_;
  local_e8._0_8_ = (element_type *)0x0;
  std::__uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>::
  reset((__uniq_ptr_impl<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>_>
         *)this_01,(pointer)__k);
  uVar8 = local_e8._0_8_;
  if ((element_type *)local_e8._0_8_ != (element_type *)0x0) {
    duckdb::CachingFileHandle::~CachingFileHandle((CachingFileHandle *)local_e8._0_8_);
    operator_delete((void *)uVar8);
  }
  unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>::
  operator->(this_01);
  cVar9 = duckdb::CachingFileHandle::CanSeek();
  if (cVar9 == '\0') {
    this_04 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_e8._0_8_ = local_e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e8,
               "Reading parquet files from a FIFO stream is not supported and cannot be efficiently supported since metadata is located at the end of the file. Write the stream to disk first and read from there instead."
               ,"");
    duckdb::NotImplementedException::NotImplementedException(this_04,(string *)local_e8);
    __cxa_throw(this_04,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_110.index = 0xffffffffffffffff;
  if ((this->super_BaseFileReader).file.extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    this_00 = &(this->super_BaseFileReader).file.extended_info;
    shared_ptr<duckdb::ExtendedOpenFileInfo,_true>::operator->(this_00);
    local_88 = metadata_p;
    p_Var12 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)shared_ptr<duckdb::ExtendedOpenFileInfo,_true>::operator->(this_00);
    peVar6 = (element_type *)(local_e8 + 0x10);
    local_e8._0_8_ = peVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"encryption_key","");
    iVar13 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(p_Var12,(key_type *)local_e8);
    if ((element_type *)local_e8._0_8_ != peVar6) {
      operator_delete((void *)local_e8._0_8_);
    }
    if (iVar13.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ._M_cur != (__node_type *)0x0) {
      __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               duckdb::StringValue::Get_abi_cxx11_
                         ((Value *)((long)iVar13.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                          ._M_cur + 0x28));
      local_e8._0_8_ = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<duckdb::ParquetEncryptionConfig,std::allocator<duckdb::ParquetEncryptionConfig>,std::__cxx11::string_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
                 (ParquetEncryptionConfig **)local_e8,
                 (allocator<duckdb::ParquetEncryptionConfig> *)local_108,__args);
      uVar8 = local_e8._0_8_;
      if ((_Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
           )local_e8._8_8_ != (GeoParquetFileMetadata *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_e8._8_8_ + 8) = *(_Atomic_word *)(local_e8._8_8_ + 8) + 1;
          UNLOCK();
          if ((_Tuple_impl<0UL,_duckdb::GeoParquetFileMetadata_*,_std::default_delete<duckdb::GeoParquetFileMetadata>_>
               )local_e8._8_8_ == (GeoParquetFileMetadata *)0x0) goto LAB_002a7a75;
        }
        else {
          *(_Atomic_word *)(local_e8._8_8_ + 8) = *(_Atomic_word *)(local_e8._8_8_ + 8) + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
      }
LAB_002a7a75:
      (this->parquet_options).encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar8;
      p_Var15 = (this->parquet_options).encryption_config.internal.
                super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->parquet_options).encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      }
    }
    p_Var12 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)shared_ptr<duckdb::ExtendedOpenFileInfo,_true>::operator->(this_00);
    local_e8._0_8_ = peVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"footer_size","");
    __k = (key_type *)local_e8;
    iVar13 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(p_Var12,__k);
    if ((element_type *)local_e8._0_8_ != peVar6) {
      operator_delete((void *)local_e8._0_8_);
    }
    metadata_p = local_88;
    if (iVar13.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
        ._M_cur != (__node_type *)0x0) {
      __k = (key_type *)
            duckdb::UBigIntValue::Get
                      ((Value *)((long)iVar13.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                                       ._M_cur + 0x28));
      optional_idx::optional_idx((optional_idx *)local_e8,(idx_t)__k);
      local_110.index = local_e8._0_8_;
    }
  }
  lVar14 = duckdb::DBConfig::GetConfig(context_p);
  this_02 = &this->encryption_util;
  if ((*(long *)(lVar14 + 0x648) == 0) || ((this->parquet_options).debug_use_openssl != true)) {
    p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var15->_M_use_count = 1;
    p_Var15->_M_weak_count = 1;
    p_Var15->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0049b498;
    p_Var15[1]._vptr__Sp_counted_base = (_func_int **)&PTR_CreateEncryptionState_0049b4e8;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var15->_M_use_count = 2;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
    (this->encryption_util).internal.
    super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var15 + 1);
    p_Var4 = (this->encryption_util).internal.
             super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (this->encryption_util).internal.
    super___shared_ptr<duckdb::EncryptionUtil,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var15;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
  }
  else {
    __k = (key_type *)(lVar14 + 0x648);
    shared_ptr<duckdb::EncryptionUtil,_true>::operator=
              (this_02,(shared_ptr<duckdb::EncryptionUtil,_true> *)__k);
  }
  peVar3 = (metadata_p->internal).
           super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    p_Var15 = (metadata_p->internal).
              super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (metadata_p->internal).
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (metadata_p->internal).
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3
    ;
    p_Var4 = (this->metadata).internal.
             super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var15;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    goto LAB_002a7efc;
  }
  duckdb::Value::Value((Value *)local_e8,0);
  local_108 = (undefined1  [8])local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"parquet_metadata_cache","");
  duckdb::ClientContext::TryGetCurrentSetting((string *)context_p,(Value *)local_108);
  if (local_108 != (undefined1  [8])local_f8) {
    operator_delete((void *)local_108);
  }
  bVar10 = duckdb::Value::GetValue<bool>();
  if (bVar10) {
    unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>::
    operator->(this_01);
    lVar14 = duckdb::CachingFileHandle::GetLastModifiedTime();
    __k = (key_type *)duckdb::ObjectCache::GetObjectCache(context_p);
    ObjectCache::Get<duckdb::ParquetFileMetadataCache>((ObjectCache *)local_108,__k);
    p_Var4 = p_Stack_100;
    auVar16 = local_108;
    local_108 = (undefined1  [8])0x0;
    p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)auVar16;
    p_Var15 = (this->metadata).internal.
              super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var4;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
      }
      auVar16 = (undefined1  [8])
                (this->metadata).internal.
                super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    }
    if (auVar16 != (undefined1  [8])0x0) {
      pPVar17 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->(&this->metadata);
      if (lVar14 + 10 < pPVar17->read_time) goto LAB_002a7ef2;
    }
    pAVar11 = this->allocator;
    pCVar18 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
              ::operator*(this_01);
    local_120.internal.
    super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->parquet_options).encryption_config.internal.
         super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_120.internal.
    super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->parquet_options).encryption_config.internal.
         super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    if (local_120.internal.
        super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_120.internal.
         super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_120.internal.
              super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_120.internal.
         super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_120.internal.
              super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    pEVar19 = shared_ptr<duckdb::EncryptionUtil,_true>::operator*(this_02);
    LoadMetadata((duckdb *)local_108,context_p,pAVar11,pCVar18,&local_120,pEVar19,local_110);
    p_Var15 = (this->metadata).internal.
              super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_108;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Stack_100;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
    }
    if (local_120.internal.
        super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_120.internal.
                 super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    this_03 = (ObjectCache *)duckdb::ObjectCache::GetObjectCache(context_p);
    pcVar5 = (this->super_BaseFileReader).file.path._M_dataplus._M_p;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar5,
               pcVar5 + (this->super_BaseFileReader).file.path._M_string_length);
    local_a0.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = &((this->metadata).internal.
               super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ObjectCacheEntry;
    local_a0.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->metadata).internal.
         super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_a0.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a0.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a0.internal.
              super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a0.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a0.internal.
              super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    __k = &local_80;
    ObjectCache::Put(this_03,__k,&local_a0);
    if (local_a0.internal.super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.internal.
                 super___shared_ptr<duckdb::ObjectCacheEntry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  else {
    pAVar11 = this->allocator;
    pCVar18 = unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
              ::operator*(this_01);
    local_120.internal.
    super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->parquet_options).encryption_config.internal.
         super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_120.internal.
    super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->parquet_options).encryption_config.internal.
         super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    if (local_120.internal.
        super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_120.internal.
         super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_120.internal.
              super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_120.internal.
         super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_120.internal.
              super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    pEVar19 = shared_ptr<duckdb::EncryptionUtil,_true>::operator*(this_02);
    LoadMetadata((duckdb *)local_108,context_p,pAVar11,pCVar18,&local_120,pEVar19,local_110);
    p_Var15 = (this->metadata).internal.
              super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_108;
    (this->metadata).internal.
    super___shared_ptr<duckdb::ParquetFileMetadataCache,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Stack_100;
    __k = (key_type *)context_p;
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
      __k = (key_type *)context_p;
    }
    if (local_120.internal.
        super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_120.internal.
                 super___shared_ptr<const_duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
LAB_002a7ef2:
  duckdb::Value::~Value((Value *)local_e8);
LAB_002a7efc:
  InitializeSchema(this,(ClientContext *)__k);
  return;
}

Assistant:

ParquetReader::ParquetReader(ClientContext &context_p, OpenFileInfo file_p, ParquetOptions parquet_options_p,
                             shared_ptr<ParquetFileMetadataCache> metadata_p)
    : BaseFileReader(std::move(file_p)), fs(CachingFileSystem::Get(context_p)),
      allocator(BufferAllocator::Get(context_p)), parquet_options(std::move(parquet_options_p)) {
	file_handle = fs.OpenFile(file, FileFlags::FILE_FLAGS_READ);
	if (!file_handle->CanSeek()) {
		throw NotImplementedException(
		    "Reading parquet files from a FIFO stream is not supported and cannot be efficiently supported since "
		    "metadata is located at the end of the file. Write the stream to disk first and read from there instead.");
	}

	// read the extended file open info (if any)
	optional_idx footer_size;
	if (file.extended_info) {
		auto &open_options = file.extended_info->options;
		auto encryption_entry = file.extended_info->options.find("encryption_key");
		if (encryption_entry != open_options.end()) {
			parquet_options.encryption_config =
			    make_shared_ptr<ParquetEncryptionConfig>(StringValue::Get(encryption_entry->second));
		}
		auto footer_entry = file.extended_info->options.find("footer_size");
		if (footer_entry != open_options.end()) {
			footer_size = UBigIntValue::Get(footer_entry->second);
		}
	}
	// set pointer to factory method for AES state
	auto &config = DBConfig::GetConfig(context_p);
	if (config.encryption_util && parquet_options.debug_use_openssl) {
		encryption_util = config.encryption_util;
	} else {
		encryption_util = make_shared_ptr<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLSFactory>();
	}

	// If metadata cached is disabled
	// or if this file has cached metadata
	// or if the cached version already expired
	if (!metadata_p) {
		Value metadata_cache = false;
		context_p.TryGetCurrentSetting("parquet_metadata_cache", metadata_cache);
		if (!metadata_cache.GetValue<bool>()) {
			metadata = LoadMetadata(context_p, allocator, *file_handle, parquet_options.encryption_config,
			                        *encryption_util, footer_size);
		} else {
			auto last_modify_time = file_handle->GetLastModifiedTime();
			metadata = ObjectCache::GetObjectCache(context_p).Get<ParquetFileMetadataCache>(file.path);
			if (!metadata || (last_modify_time + 10 >= metadata->read_time)) {
				metadata = LoadMetadata(context_p, allocator, *file_handle, parquet_options.encryption_config,
				                        *encryption_util, footer_size);
				ObjectCache::GetObjectCache(context_p).Put(file.path, metadata);
			}
		}
	} else {
		metadata = std::move(metadata_p);
	}
	InitializeSchema(context_p);
}